

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O1

bool __thiscall ON_PolyEdgeCurve::ChangeClosedCurveSeam(ON_PolyEdgeCurve *this,double t)

{
  bool bVar1;
  int iVar2;
  ON_PolyEdgeSegment *pOVar3;
  double *pdVar4;
  bool bVar5;
  ON_PolyEdgeSegment *new_segment;
  double dVar6;
  ON_Interval crvd;
  ON_Curve *right;
  ON_Curve *left;
  double st [3];
  ON_Interval local_68;
  ON_PolyEdgeSegment *local_58;
  ON_PolyEdgeSegment *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  iVar2 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
  if (iVar2 != 1) goto LAB_0059752b;
  iVar2 = (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[0x34])(this);
  if ((char)iVar2 == '\0') {
    return false;
  }
  (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])(this);
  dVar6 = ON_Interval::NormalizedParameterAt(&local_68,t);
  if ((dVar6 <= 1.490116119385e-08) || (0.9999999850988388 <= dVar6)) {
    dVar6 = fmod(dVar6,1.0);
    dVar6 = (double)(~-(ulong)(dVar6 < 0.0) & (ulong)dVar6 |
                    (ulong)(dVar6 + 1.0) & -(ulong)(dVar6 < 0.0));
    if ((1.490116119385e-08 < ABS(dVar6)) && (1.490116119385e-08 < ABS(1.0 - dVar6)))
    goto LAB_005974bd;
    bVar1 = false;
    pdVar4 = ON_Interval::operator[](&local_68,0);
    bVar5 = true;
    if ((*pdVar4 != t) || (NAN(*pdVar4) || NAN(t))) {
      (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
        [0x17])(this,1);
      dVar6 = ON_Interval::Length(&local_68);
      (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
        [0x26])(t,dVar6 + t,this);
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
    pOVar3 = SegmentCurve(this,0);
    if (pOVar3 != (ON_PolyEdgeSegment *)0x0) {
      (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
        [0x17])(this,1);
      local_58 = (ON_PolyEdgeSegment *)0x0;
      local_50 = pOVar3;
      ON_PolyCurve::SegmentCurveParameter(&this->super_ON_PolyCurve,t);
      iVar2 = (*(pOVar3->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                _vptr_ON_Object[0x3e])(pOVar3,&local_50,&local_58);
      if ((char)iVar2 != '\0') {
        pdVar4 = ON_Interval::operator[](&local_68,0);
        (*(this->super_ON_PolyCurve).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x26])(*pdVar4,t,this);
        pOVar3 = local_58;
        new_segment = (ON_PolyEdgeSegment *)0x0;
        if (local_58 != (ON_PolyEdgeSegment *)0x0) {
          bVar1 = ON_Object::IsKindOf((ON_Object *)local_58,
                                      &ON_PolyEdgeSegment::m_ON_PolyEdgeSegment_class_rtti);
          new_segment = (ON_PolyEdgeSegment *)0x0;
          if (bVar1) {
            new_segment = pOVar3;
          }
        }
        if (new_segment != (ON_PolyEdgeSegment *)0x0) {
          Append(this,new_segment);
          pdVar4 = ON_Interval::operator[](&local_68,0);
          local_48 = *pdVar4;
          local_40 = t;
          pdVar4 = ON_Interval::operator[](&local_68,1);
          local_38 = *pdVar4;
          ON_PolyCurve::SetParameterization(&this->super_ON_PolyCurve,&local_48);
          bVar1 = true;
          goto LAB_005974c0;
        }
      }
LAB_005974bd:
      bVar1 = false;
    }
LAB_005974c0:
    bVar5 = false;
  }
  if (!bVar1) {
    return bVar5;
  }
LAB_0059752b:
  bVar1 = ON_PolyCurve::ChangeClosedCurveSeam(&this->super_ON_PolyCurve,t);
  return bVar1;
}

Assistant:

bool ON_PolyEdgeCurve::ChangeClosedCurveSeam( double t )
{
  //int saved_is_closed_helper = m_is_closed_helper;

  if ( SegmentCount() == 1 )
  {
    // A ON_PolyEdgeSegment cannot have its start/end
    // changed. Split it into two segments and let 
    // ON_PolyCurve::ChangeClosedCurveSeam() do the work.
    if ( !IsClosed() )
      return false;

    ON_Interval crvd = Domain();
    double s = crvd.NormalizedParameterAt(t);

    if ( s <= ON_SQRT_EPSILON || s >= (1.0 - ON_SQRT_EPSILON) )
    {
      s = fmod(s,1.0);
      if ( s < 0.0 )
        s += 1.0;
      if ( fabs(s) <= ON_SQRT_EPSILON || fabs(1.0-s) <= ON_SQRT_EPSILON )
      {
        // split parameter is at start/end of this segment
        if ( t != crvd[0] )
        {
          DestroyRuntimeCache();
          SetDomain(t,t+crvd.Length() );
          //m_is_closed_helper = saved_is_closed_helper;
        }
        return true;
      }
      return false;
    }

    ON_PolyEdgeSegment* left_seg = SegmentCurve(0);
    if ( 0 == left_seg )
      return false;

    DestroyRuntimeCache();

    ON_Curve* left = left_seg;
    ON_Curve* right = 0;
    double segt = SegmentCurveParameter(t);
    if ( !left_seg->Split(segt,left,right) )
      return false;
    SetDomain(crvd[0],t);
    
    ON_PolyEdgeSegment* right_seg = ON_PolyEdgeSegment::Cast(right);
    if ( 0 == right_seg )
      return false;
    Append(right_seg);

    double st[3];
    st[0] = crvd[0];
    st[1] = t;
    st[2] = crvd[1];
    SetParameterization( st );
  }

  // ON_PolyCurve::ChangeClosedCurveSeam works fine on
  // two or more segments.
  bool rc = ON_PolyCurve::ChangeClosedCurveSeam(t);
  //if ( saved_is_closed_helper )
  //  m_is_closed_helper = saved_is_closed_helper;

  return rc;
}